

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_htmlify(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  uint uVar1;
  bool bVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  uint uVar7;
  wchar_t wVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  bool bVar14;
  utf8_ptr dstp;
  utf8_ptr p;
  size_t rem;
  vm_obj_id_t local_4c;
  ulong local_48;
  char *local_40;
  vm_val_t *local_38;
  
  p.p_ = (char *)0x0;
  dstp.p_ = (char *)0x0;
  if (in_argc == (uint *)0x0) {
    bVar14 = true;
  }
  else {
    bVar14 = *in_argc == 0;
  }
  if (getp_htmlify(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar6 = __cxa_guard_acquire(&getp_htmlify(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                 desc);
    if (iVar6 != 0) {
      getp_htmlify::desc.min_argc_ = 0;
      getp_htmlify::desc.opt_argc_ = 1;
      getp_htmlify::desc.varargs_ = 0;
      __cxa_guard_release(&getp_htmlify(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
    }
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_htmlify::desc);
  if (iVar6 == 0) {
    bVar2 = false;
    local_38 = retval;
    if (bVar14) {
      uVar7 = 0;
    }
    else {
      uVar7 = CVmBif::pop_long_val();
    }
    pvVar5 = sp_;
    uVar4 = *(undefined4 *)&self_val->field_0x4;
    aVar3 = self_val->val;
    sp_ = sp_ + 1;
    pvVar5->typ = self_val->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar3;
    uVar11 = (ulong)*(ushort *)str;
    p.p_ = str + 2;
    local_48 = (ulong)(uVar7 & 4);
    lVar13 = 0;
    rem = uVar11;
    local_40 = p.p_;
    while (rem != 0) {
      wVar8 = utf8_ptr::s_getch(p.p_);
      if (wVar8 == L'\t') {
        lVar13 = lVar13 + local_48;
LAB_002a3d99:
        bVar2 = true;
      }
      else {
        if (wVar8 == L'\n') {
LAB_002a3d77:
          lVar9 = lVar13 + 3;
          uVar1 = uVar7 & 2;
LAB_002a3d95:
          if (uVar1 != 0) {
            lVar13 = lVar9;
          }
          goto LAB_002a3d99;
        }
        if (wVar8 == L' ') {
          lVar9 = lVar13 + 5;
          if (!bVar2) {
            lVar9 = lVar13;
          }
          uVar1 = uVar7 & 1;
          goto LAB_002a3d95;
        }
        if (wVar8 == L'\x2028') goto LAB_002a3d77;
        if ((wVar8 == L'<') || (wVar8 == L'>')) {
          lVar13 = lVar13 + 3;
          bVar2 = false;
        }
        else {
          bVar2 = false;
          if (wVar8 == L'&') {
            lVar13 = lVar13 + 4;
            bVar2 = false;
          }
        }
      }
      utf8_ptr::inc(&p,&rem);
    }
    bVar14 = false;
    local_4c = create(0,lVar13 + uVar11);
    dstp.p_ = (char *)(*(long *)((long)&G_obj_table_X.pages_[local_4c >> 0xc][local_4c & 0xfff].ptr_
                                + 8) + 2);
    p.p_ = local_40;
    rem = uVar11;
    while (rem != 0) {
      wVar8 = utf8_ptr::s_getch(p.p_);
      if (wVar8 == L'\t') {
        bVar14 = true;
        if (local_48 == 0) goto LAB_002a3eb3;
        pcVar12 = "<tab>";
LAB_002a3ece:
        utf8_ptr::setch_str(&dstp,pcVar12);
        bVar14 = true;
      }
      else if (wVar8 == L'\n') {
LAB_002a3e55:
        bVar14 = true;
        if ((uVar7 & 2) != 0) {
          pcVar12 = "<br>";
          goto LAB_002a3ece;
        }
LAB_002a3eb3:
        sVar10 = utf8_ptr::s_putch(dstp.p_,wVar8);
        dstp.p_ = dstp.p_ + sVar10;
      }
      else {
        if (wVar8 == L' ') {
          bVar2 = bVar14 && (uVar7 & 1) != 0;
          bVar14 = true;
          if (bVar2) {
            pcVar12 = "&nbsp;";
            goto LAB_002a3ece;
          }
          goto LAB_002a3eb3;
        }
        if (wVar8 == L'\x2028') goto LAB_002a3e55;
        if (wVar8 == L'<') {
          pcVar12 = "&lt;";
        }
        else if (wVar8 == L'>') {
          pcVar12 = "&gt;";
        }
        else {
          bVar14 = false;
          if (wVar8 != L'&') goto LAB_002a3eb3;
          pcVar12 = "&amp;";
        }
        utf8_ptr::setch_str(&dstp,pcVar12);
        bVar14 = false;
      }
      utf8_ptr::inc(&p,&rem);
    }
    local_38->typ = VM_OBJ;
    (local_38->val).obj = local_4c;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_htmlify(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val,
                               const char *str, uint *in_argc)
{
    size_t bytelen;
    utf8_ptr p;
    utf8_ptr dstp;
    size_t rem;
    size_t extra;
    long flags;
    vm_obj_id_t result_obj;
    int prv_was_sp;

    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* if they specified flags, pop them */
    if (argc >= 1)
    {
        /* retrieve the flags */
        flags = CVmBif::pop_long_val(vmg0_);
    }
    else
    {
        /* no flags */
        flags = 0;
    }

    /* push a self-reference as GC protection */
    G_stk->push(self_val);

    /* get and skip the string's length prefix */
    bytelen = vmb_get_len(str);
    str += VMB_LEN;

    /* 
     *   scan the string to determine how much space we'll have to add to
     *   generate the htmlified version 
     */
    for (prv_was_sp = FALSE, extra = 0, p.set((char *)str), rem = bytelen ;
         rem != 0 ; p.inc(&rem))
    {
        int this_is_sp;

        /* presume it's not a space */
        this_is_sp = FALSE;
        
        /* check what we have */
        switch(p.getch())
        {
        case '&':
            /* we must replace '&' with '&amp;' - this adds four bytes */
            extra += 4;
            break;
            
        case '<':
            /* we must replace '<' with '&lt;' - this adds three bytes */
            extra += 3;
            break;

        case '>':
            /* replace '>' with '&gt;' */
            extra += 3;
            break;

        case ' ':
            /* 
             *   If we're in preserve-spaces mode, and the previous space
             *   was some kind of whitespace character, change this to
             *   '&nbsp;' - this adds five bytes 
             */
            if (prv_was_sp && (flags & VMSTR_HTMLIFY_KEEP_SPACES) != 0)
                extra += 5;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;

        case '\t':
            /* if we're in preserve-tabs mode, change this to '<tab>' */
            if ((flags & VMSTR_HTMLIFY_KEEP_TABS) != 0)
                extra += 4;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;

        case '\n':
        case 0x2028:
            /* if we're in preserve-newlines mode, change this to '<br>' */
            if ((flags & VMSTR_HTMLIFY_KEEP_NEWLINES) != 0)
                extra += 3;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;
        }

        /* for next time, remember whether this is a space */
        prv_was_sp = this_is_sp;
    }

    /* allocate space for the new string */
    result_obj = create(vmg_ FALSE, bytelen + extra);

    /* get a pointer to the result buffer */
    dstp.set(((CVmObjString *)vm_objp(vmg_ result_obj))->cons_get_buf());

    /* translate the string and write the result */
    for (prv_was_sp = FALSE, p.set((char *)str), rem = bytelen ;
         rem != 0 ; p.inc(&rem))
    {
        wchar_t ch;
        int this_is_sp;

        /* get this character */
        ch = p.getch();

        /* presume it's not a space */
        this_is_sp = FALSE;
        
        /* check what we have */
        switch(ch)
        {
        case '&':
            /* replace '&' with '&amp;' */
            dstp.setch_str("&amp;");
            break;

        case '<':
            /* we must replace '<' with '&lt;' - this adds three bytes */
            dstp.setch_str("&lt;");
            break;

        case '>':
            dstp.setch_str("&gt;");
            break;

        case ' ':
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* 
             *   ignore it if not in preserve-spaces mode, or if the
             *   previous character wasn't whitespace of some kind 
             */
            if (!prv_was_sp || (flags & VMSTR_HTMLIFY_KEEP_SPACES) == 0)
                goto do_default;

            /* add the nbsp */
            dstp.setch_str("&nbsp;");
            break;

        case '\t':
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* ignore if not in preserve-tabs mode */
            if ((flags & VMSTR_HTMLIFY_KEEP_TABS) == 0)
                goto do_default;

            /* add the <tab> */
            dstp.setch_str("<tab>");
            break;

        case '\n':
        case 0x2028:
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* if we're not in preserve-newlines mode, ignore it */
            if ((flags & VMSTR_HTMLIFY_KEEP_NEWLINES) == 0)
                goto do_default;

            /* add the <br> */
            dstp.setch_str("<br>");
            break;

        default:
        do_default:
            /* copy this character unchanged */
            dstp.setch(ch);
            break;
        }

        /* for next time, remember whether this is a space */
        prv_was_sp = this_is_sp;
    }

    /* return the new string */
    retval->set_obj(result_obj);
    
    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}